

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O0

unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> __thiscall
anon_unknown.dwarf_53533::ParserImpl::ParseTableArrayField(ParserImpl *this)

{
  TokenDetail *pTVar1;
  __uniq_ptr_data<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>,_true,_true> in_RDI;
  unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> value;
  int line;
  int in_stack_0000012c;
  unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> *in_stack_00000130;
  ParserImpl *in_stack_00000138;
  undefined1 in_stack_00000150 [32];
  ParserImpl *in_stack_ffffffffffffff50;
  anon_union_8_2_010d16d7_for_TokenDetail_0 local_48;
  unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> *puStack_40;
  unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> *local_38;
  TableArrayField *pTStack_30;
  int local_14;
  
  pTVar1 = LookAhead(in_stack_ffffffffffffff50);
  local_14 = pTVar1->line_;
  std::unique_ptr<luna::SyntaxTree,std::default_delete<luna::SyntaxTree>>::
  unique_ptr<std::default_delete<luna::SyntaxTree>,void>
            ((unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> *)
             in_stack_ffffffffffffff50);
  luna::TokenDetail::TokenDetail((TokenDetail *)&local_48);
  ParseExp(in_stack_00000138,in_stack_00000130,(TokenDetail)in_stack_00000150,in_stack_0000012c);
  std::unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>::~unique_ptr
            ((unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> *)pTStack_30);
  operator_new(0x18);
  std::unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>::unique_ptr
            (puStack_40,
             (unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> *)local_48.str_);
  luna::TableArrayField::TableArrayField(pTStack_30,local_38,(int)((ulong)puStack_40 >> 0x20));
  std::unique_ptr<luna::SyntaxTree,std::default_delete<luna::SyntaxTree>>::
  unique_ptr<std::default_delete<luna::SyntaxTree>,void>(puStack_40,(pointer)local_48.str_);
  std::unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>::~unique_ptr
            ((unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> *)pTStack_30);
  std::unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>::~unique_ptr
            ((unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> *)pTStack_30);
  return (__uniq_ptr_data<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>,_true,_true>)
         (tuple<luna::SyntaxTree_*,_std::default_delete<luna::SyntaxTree>_>)
         in_RDI.super___uniq_ptr_impl<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>._M_t
         .super__Tuple_impl<0UL,_luna::SyntaxTree_*,_std::default_delete<luna::SyntaxTree>_>.
         super__Head_base<0UL,_luna::SyntaxTree_*,_false>._M_head_impl;
}

Assistant:

std::unique_ptr<SyntaxTree> ParseTableArrayField()
        {
            int line = LookAhead().line_;
            std::unique_ptr<SyntaxTree> value = ParseExp();
            return std::unique_ptr<SyntaxTree>(new TableArrayField(std::move(value), line));
        }